

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint string_resize(char **out,size_t size)

{
  char *pcVar1;
  char *data;
  size_t size_local;
  char **out_local;
  
  pcVar1 = (char *)lodepng_realloc(*out,size + 1);
  if (pcVar1 != (char *)0x0) {
    pcVar1[size] = '\0';
    *out = pcVar1;
  }
  return (uint)(pcVar1 != (char *)0x0);
}

Assistant:

static unsigned string_resize(char** out, size_t size)
{
  char* data = (char*)lodepng_realloc(*out, size + 1);
  if(data)
  {
    data[size] = 0; /*null termination char*/
    *out = data;
  }
  return data != 0;
}